

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Activation.h
# Opt level: O2

MatrixXd * __thiscall
LeakyReLu::calculate(MatrixXd *__return_storage_ptr__,LeakyReLu *this,MatrixXd *x)

{
  MatrixXd *local_e0;
  MatrixXd *local_d8;
  type local_d0;
  CwiseBinaryOp<Eigen::internal::scalar_max_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,__1,_0,__1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
  local_a0;
  NestedExpressionType local_60 [2];
  long local_50;
  long lStack_48;
  double local_40;
  NestedExpressionType local_38;
  
  local_e0 = x;
  local_d8 = x;
  Eigen::operator*(&local_d0,&this->alpha,(StorageBaseType *)&local_e0);
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,-1,-1,0,-1,-1>const>>::
  max<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,_1,0,_1,_1>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
            (&local_a0,&local_d8,
             (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,__1,_0,__1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
              *)&local_d0);
  local_60[0] = local_a0.m_lhs.m_expression;
  local_50 = local_a0.m_rhs.m_lhs.m_rows.m_value;
  lStack_48 = local_a0.m_rhs.m_lhs.m_cols.m_value;
  local_40 = local_a0.m_rhs.m_lhs.m_functor.m_other;
  local_38 = local_a0.m_rhs.m_rhs.m_expression;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_max_op<double,double>,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,_1,0,_1,_1>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)__return_storage_ptr__,
             (DenseBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_max_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,__1,_0,__1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>_>
              *)local_60);
  return __return_storage_ptr__;
}

Assistant:

Eigen::MatrixXd calculate(const Eigen::MatrixXd& x) override{
		return x.array().max(alpha*x.array()).matrix();
	}